

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O2

void Sfm_TimNodeRequired(Sfm_Tim_t *p,Abc_Obj_t *pNode)

{
  Mio_Gate_t *pGate;
  uint i;
  Mio_PinPhase_t MVar1;
  int *piVar2;
  int *piVar3;
  Mio_Pin_t *pPin;
  int iVar4;
  int iVar5;
  int iVar6;
  Abc_Obj_t *pAVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  int *pTimesIn [6];
  undefined8 auStack_68 [7];
  
  pAVar7 = pNode;
  piVar2 = Sfm_TimReq(p,pNode);
  iVar4 = (pNode->vFanins).nSize;
  if (6 < iVar4) {
    __assert_fail("Abc_ObjFaninNum(pNode) <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                  ,0x88,"void Sfm_TimNodeRequired(Sfm_Tim_t *, Abc_Obj_t *)");
  }
  for (lVar8 = 0; lVar8 < iVar4; lVar8 = lVar8 + 1) {
    i = Abc_Var2Lit((pNode->vFanins).pArray[lVar8],(int)pAVar7);
    pAVar7 = (Abc_Obj_t *)(ulong)i;
    piVar3 = Vec_IntEntryP(&p->vTimReqs,i);
    auStack_68[lVar8] = piVar3;
    iVar4 = (pNode->vFanins).nSize;
  }
  pGate = (Mio_Gate_t *)(pNode->field_5).pData;
  pPin = Mio_GateReadPins(pGate);
  lVar8 = 0;
  do {
    if (pPin == (Mio_Pin_t *)0x0) {
      iVar4 = Mio_GateReadPinNum(pGate);
      if (iVar4 == (int)lVar8) {
        return;
      }
      __assert_fail("i == Mio_GateReadPinNum(pGate)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                    ,0x82,"void Sfm_TimGateRequired(Sfm_Tim_t *, Mio_Gate_t *, int **, int *)");
    }
    piVar3 = (int *)auStack_68[lVar8];
    MVar1 = Mio_PinReadPhase(pPin);
    dVar9 = Mio_PinReadDelayBlockRise(pPin);
    dVar10 = Mio_PinReadDelayBlockFall(pPin);
    iVar4 = *piVar3;
    if (MVar1 == MIO_PHASE_INV) {
      iVar5 = piVar3[1];
LAB_00453529:
      iVar6 = piVar2[1] - (int)((float)dVar9 * 1000.0);
      if (iVar4 < iVar6) {
        iVar6 = iVar4;
      }
      *piVar3 = iVar6;
      iVar4 = *piVar2 - (int)((float)dVar10 * 1000.0);
      if (iVar5 < iVar4) {
        iVar4 = iVar5;
      }
      piVar3[1] = iVar4;
    }
    else {
      iVar5 = *piVar2 - (int)((float)dVar9 * 1000.0);
      if (iVar5 <= iVar4) {
        iVar4 = iVar5;
      }
      *piVar3 = iVar4;
      iVar5 = piVar2[1] - (int)((float)dVar10 * 1000.0);
      if (piVar3[1] < iVar5) {
        iVar5 = piVar3[1];
      }
      piVar3[1] = iVar5;
      if (MVar1 != MIO_PHASE_NONINV) goto LAB_00453529;
    }
    pPin = Mio_PinReadNext(pPin);
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void Sfm_TimNodeRequired( Sfm_Tim_t * p, Abc_Obj_t * pNode )
{
    int i, iFanin, * pTimesIn[6];
    int * pTimeOut = Sfm_TimReq(p, pNode);
    assert( Abc_ObjFaninNum(pNode) <= 6 );
    Abc_ObjForEachFaninId( pNode, iFanin, i )
        pTimesIn[i] = Sfm_TimReqId( p, iFanin );
    Sfm_TimGateRequired( p, (Mio_Gate_t *)pNode->pData, pTimesIn, pTimeOut );
}